

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

vector<BigInt,_std::allocator<BigInt>_> * __thiscall
BigInt::div_and_mod(vector<BigInt,_std::allocator<BigInt>_> *__return_storage_ptr__,BigInt *this,
                   BigInt *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BigInt *pBVar4;
  BigInt *pBVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  runtime_error *this_00;
  long lVar9;
  pointer piVar10;
  initializer_list<BigInt> __l;
  initializer_list<BigInt> __l_00;
  initializer_list<BigInt> __l_01;
  BigInt temp_1;
  BigInt j;
  BigInt divided;
  BigInt ans;
  BigInt divisor;
  BigInt one;
  BigInt temp;
  ulong local_250;
  BigInt *local_248;
  vector<BigInt,_std::allocator<BigInt>_> *local_240;
  BigInt *local_238;
  BigInt local_230;
  BigInt local_210;
  BigInt local_1f0;
  BigInt local_1d0;
  BigInt local_1b0;
  BigInt local_190;
  BigInt local_170;
  BigInt local_150;
  BigInt local_130;
  BigInt local_110;
  BigInt local_f0;
  BigInt local_d0;
  BigInt local_b0;
  BigInt local_90;
  BigInt local_70;
  BigInt local_50;
  
  local_248 = this;
  local_240 = __return_storage_ptr__;
  BigInt(&local_230,0);
  local_238 = b;
  bVar6 = operator==(b,&local_230);
  if (local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pBVar4 = local_248;
  if (!bVar6) {
    std::vector<int,_std::allocator<int>_>::vector(&local_230.value,&local_248->value);
    pBVar5 = local_238;
    local_230.real_length = pBVar4->real_length;
    local_230.sign = pBVar4->sign;
    local_230._24_8_ = local_230._24_8_ & 0xffffffff;
    *local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    std::vector<int,_std::allocator<int>_>::vector(&local_1f0.value,&local_238->value);
    uVar1._0_4_ = pBVar5->real_length;
    uVar1._4_4_ = pBVar5->sign;
    local_1f0._24_8_ = uVar1 & 0xffffffff;
    *local_1f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    bVar6 = operator<(&local_230,&local_1f0);
    if (local_1f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pBVar5 = local_238;
    pBVar4 = local_248;
    if (bVar6) {
      std::vector<int,_std::allocator<int>_>::vector(&local_1f0.value,&local_248->value);
      local_1f0.real_length = pBVar4->real_length;
      local_1f0.sign = pBVar4->sign;
      BigInt(&local_230,0);
      std::vector<int,_std::allocator<int>_>::vector(&local_210.value,&local_1f0.value);
      local_210.real_length = local_1f0.real_length;
      local_210.sign = local_1f0.sign;
      __l._M_len = 2;
      __l._M_array = &local_230;
      std::vector<BigInt,_std::allocator<BigInt>_>::vector
                (local_240,__l,(allocator_type *)&local_170);
      lVar9 = 0x40;
      do {
        if (*(void **)((long)&local_250 + lVar9) != (void *)0x0) {
          operator_delete(*(void **)((long)&local_250 + lVar9));
        }
        lVar9 = lVar9 + -0x20;
      } while (lVar9 != 0);
    }
    else {
      bVar6 = operator==(local_248,local_238);
      if (bVar6) {
        BigInt(&local_230,1);
        BigInt(&local_210,0);
        __l_00._M_len = 2;
        __l_00._M_array = &local_230;
        std::vector<BigInt,_std::allocator<BigInt>_>::vector
                  (local_240,__l_00,(allocator_type *)&local_1f0);
        lVar9 = 0x40;
        do {
          if (*(void **)((long)&local_250 + lVar9) != (void *)0x0) {
            operator_delete(*(void **)((long)&local_250 + lVar9));
          }
          lVar9 = lVar9 + -0x20;
        } while (lVar9 != 0);
        return local_240;
      }
      iVar7 = get_real_length(pBVar4);
      local_250 = CONCAT44(extraout_var,iVar7);
      iVar7 = get_real_length(pBVar5);
      BigInt(&local_1f0,0);
      BigInt(&local_170,1);
      BigInt(&local_1b0,1);
      pBVar4 = local_248;
      std::vector<int,_std::allocator<int>_>::vector(&local_1d0.value,&local_248->value);
      pBVar5 = local_238;
      uVar2._0_4_ = pBVar4->real_length;
      uVar2._4_4_ = pBVar4->sign;
      local_1d0._24_8_ = uVar2 & 0xffffffff;
      *local_1d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = 0;
      std::vector<int,_std::allocator<int>_>::vector(&local_190.value,&local_238->value);
      uVar3._0_4_ = pBVar5->real_length;
      uVar3._4_4_ = pBVar5->sign;
      local_190._24_8_ = uVar3 & 0xffffffff;
      *local_190.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = 0;
      BigInt(&local_150,1);
      uVar8 = (int)local_250 - iVar7;
      local_250 = (ulong)uVar8;
      if (-1 < (int)uVar8) {
        do {
          BigInt(&local_90,0);
          operator=(&local_1f0,&local_90);
          piVar10 = local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while( true ) {
            if (piVar10 != (pointer)0x0) {
              operator_delete(piVar10);
            }
            multiply(&local_b0,&local_1f0,&local_190);
            multi_ten(&local_230,&local_b0,(int)local_250);
            bVar6 = operator<(&local_1d0,&local_230);
            if (local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (bVar6) break;
            add(&local_50,&local_1f0,&local_170);
            operator=(&local_1f0,&local_50);
            piVar10 = local_50.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          operator-(&local_d0,&local_1f0,&local_170);
          operator=(&local_1f0,&local_d0);
          if (local_d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          multi_ten(&local_f0,&local_1f0,(int)local_250);
          operator=(&local_150,&local_f0);
          if (local_f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          add(&local_110,&local_1b0,&local_150);
          operator=(&local_1b0,&local_110);
          if (local_110.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          multiply(&local_230,&local_190,&local_150);
          operator-(&local_70,&local_1d0,&local_230);
          operator=(&local_1d0,&local_70);
          if (local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          iVar7 = (int)local_250;
          local_250 = (ulong)(iVar7 - 1);
        } while (0 < iVar7);
      }
      operator-(&local_130,&local_1b0,&local_170);
      operator=(&local_1b0,&local_130);
      if (local_130.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_130.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_1b0.sign = (int)((local_238->sign == 0) != (local_248->sign == 0));
      *local_1b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = local_1b0.sign;
      bVar6 = local_248->sign != 0;
      local_1d0.sign._0_1_ = bVar6;
      local_1d0.sign._1_3_ = 0;
      *local_1d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = (uint)bVar6;
      std::vector<int,_std::allocator<int>_>::vector(&local_230.value,&local_1b0.value);
      local_230._24_8_ = CONCAT44(local_1b0.sign,local_1b0.real_length);
      std::vector<int,_std::allocator<int>_>::vector(&local_210.value,&local_1d0.value);
      local_210.real_length = local_1d0.real_length;
      local_210.sign = local_1d0.sign;
      __l_01._M_len = 2;
      __l_01._M_array = &local_230;
      std::vector<BigInt,_std::allocator<BigInt>_>::vector
                (local_240,__l_01,(allocator_type *)&local_b0);
      lVar9 = 0x40;
      do {
        if (*(void **)((long)&local_250 + lVar9) != (void *)0x0) {
          operator_delete(*(void **)((long)&local_250 + lVar9));
        }
        lVar9 = lVar9 + -0x20;
      } while (lVar9 != 0);
      if (local_150.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_190.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((uint *)local_1d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_1d0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((uint *)local_1b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_1b0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_170.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_1f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return local_240;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ERROR zero, 0 could not be the divisor");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<BigInt> BigInt::div_and_mod(BigInt& b) {
    if (b == 0) {
        throw runtime_error("ERROR zero, 0 could not be the divisor");
    }
    if (this->absolute() < b.absolute()) {
        BigInt temp = *this;
        return vector<BigInt>{BigInt(0), temp};
    }
    if (*this == b) {
        return vector<BigInt>{BigInt(1), BigInt(0)};
    }
    int cost = this->get_real_length();
    if (cost < 20 && false) {
        string aa = this->to_string();
        string bb = b.to_string();
        long long int aint = stoll(aa, nullptr, 10);
        long long int bint = stoll(bb, nullptr, 10);
        return vector<BigInt>{BigInt(aint / bint), BigInt(aint % bint)};
    }
    cost -= b.get_real_length();
    BigInt j(0);
    BigInt one(1);
    BigInt ans(1);
    BigInt divided = this->absolute();
    BigInt divisor = b.absolute();
    BigInt temp(1);
    while (cost >= 0) {
        j = 0;
        while (divided >= (j * divisor).multi_ten(cost)) {
            j = j + one;
        }
        j = j - one;
        temp = j.multi_ten(cost);
        ans = ans + temp;
        divided = divided - divisor * temp;
        cost -= 1;
    }
    ans = ans - one;
    ans.set_sign(this->get_positive_sign() == b.get_positive_sign() ? true : false);
    divided.set_sign(this->get_positive_sign());
    return vector<BigInt>{ans, divided};
}